

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

double smf_get_length_seconds(smf_t *smf)

{
  smf_track_t *track_00;
  smf_event_t *psVar1;
  smf_event_t *event;
  smf_track_t *track;
  double seconds;
  int i;
  smf_t *smf_local;
  
  track = (smf_track_t *)0x0;
  seconds._4_4_ = 1;
  while( true ) {
    if (smf->number_of_tracks < seconds._4_4_) {
      return (double)track;
    }
    track_00 = smf_get_track_by_number(smf,seconds._4_4_);
    if (track_00 == (smf_track_t *)0x0) break;
    psVar1 = smf_track_get_last_event(track_00);
    if ((psVar1 != (smf_event_t *)0x0) && ((double)track < psVar1->time_seconds)) {
      track = (smf_track_t *)psVar1->time_seconds;
    }
    seconds._4_4_ = seconds._4_4_ + 1;
  }
  __assert_fail("track",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,0x434,"double smf_get_length_seconds(const smf_t *)");
}

Assistant:

double
smf_get_length_seconds(const smf_t *smf)
{
	int i;
	double seconds = 0.0;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		smf_track_t *track;
		smf_event_t *event;

	       	track = smf_get_track_by_number(smf, i);
		assert(track);

		event = smf_track_get_last_event(track);
		/* Empty track? */
		if (event == NULL)
			continue;

		if (event->time_seconds > seconds)
			seconds = event->time_seconds;
	}

	return (seconds);
}